

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_result_basepoint(void)

{
  int iVar1;
  int iVar2;
  uchar s_one [32];
  uchar *in_stack_00000020;
  secp256k1_context *in_stack_00000028;
  int i;
  uchar out_base [32];
  uchar out_inv [32];
  uchar out [32];
  uchar s_inv [32];
  uchar s [32];
  secp256k1_scalar rand;
  secp256k1_pubkey point;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  uchar *in_stack_fffffffffffffed0;
  secp256k1_scalar *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  uchar *in_stack_ffffffffffffff48;
  secp256k1_pubkey *in_stack_ffffffffffffff50;
  secp256k1_context *in_stack_ffffffffffffff58;
  
  memset(&stack0xfffffffffffffec8,0,0x20);
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x8b,"test condition failed: secp256k1_ec_pubkey_create(CTX, &point, s_one) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdh(in_stack_00000028,in_stack_00000020,(secp256k1_pubkey *)s_one._24_8_,
                         (uchar *)s_one._16_8_,(secp256k1_ecdh_hash_function)s_one._8_8_,
                         (void *)s_one._0_8_);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x8c,
            "test condition failed: secp256k1_ecdh(CTX, out_base, &point, s_one, NULL, NULL) == 1");
    abort();
  }
  iVar1 = 0;
  while( true ) {
    if (SBORROW4(iVar1,COUNT * 2) == iVar1 + COUNT * -2 < 0) {
      return;
    }
    random_scalar_order((secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffef0));
    secp256k1_scalar_get_b32(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    secp256k1_scalar_inverse
              ((secp256k1_scalar *)CONCAT44(iVar1,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    secp256k1_scalar_get_b32(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    iVar2 = secp256k1_ec_pubkey_create
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
                      );
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
              ,0x94,"test condition failed: secp256k1_ec_pubkey_create(CTX, &point, s) == 1");
      abort();
    }
    iVar2 = secp256k1_ecdh(in_stack_00000028,in_stack_00000020,(secp256k1_pubkey *)s_one._24_8_,
                           (uchar *)s_one._16_8_,(secp256k1_ecdh_hash_function)s_one._8_8_,
                           (void *)s_one._0_8_);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
              ,0x95,
              "test condition failed: secp256k1_ecdh(CTX, out, &point, s_inv, NULL, NULL) == 1");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_c8,local_108,0x20);
    if (iVar2 != 0) break;
    iVar2 = secp256k1_ec_pubkey_create
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
                      );
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
              ,0x98,"test condition failed: secp256k1_ec_pubkey_create(CTX, &point, s_inv) == 1");
      abort();
    }
    iVar2 = secp256k1_ecdh(in_stack_00000028,in_stack_00000020,(secp256k1_pubkey *)s_one._24_8_,
                           (uchar *)s_one._16_8_,(secp256k1_ecdh_hash_function)s_one._8_8_,
                           (void *)s_one._0_8_);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
              ,0x99,
              "test condition failed: secp256k1_ecdh(CTX, out_inv, &point, s, NULL, NULL) == 1");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_e8,local_108,0x20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
              ,0x9a,"test condition failed: secp256k1_memcmp_var(out_inv, out_base, 32) == 0");
      abort();
    }
    iVar1 = iVar1 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
          ,0x96,"test condition failed: secp256k1_memcmp_var(out, out_base, 32) == 0");
  abort();
}

Assistant:

static void test_result_basepoint(void) {
    secp256k1_pubkey point;
    secp256k1_scalar rand;
    unsigned char s[32];
    unsigned char s_inv[32];
    unsigned char out[32];
    unsigned char out_inv[32];
    unsigned char out_base[32];
    int i;

    unsigned char s_one[32] = { 0 };
    s_one[31] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &point, s_one) == 1);
    CHECK(secp256k1_ecdh(CTX, out_base, &point, s_one, NULL, NULL) == 1);

    for (i = 0; i < 2 * COUNT; i++) {
        random_scalar_order(&rand);
        secp256k1_scalar_get_b32(s, &rand);
        secp256k1_scalar_inverse(&rand, &rand);
        secp256k1_scalar_get_b32(s_inv, &rand);

        CHECK(secp256k1_ec_pubkey_create(CTX, &point, s) == 1);
        CHECK(secp256k1_ecdh(CTX, out, &point, s_inv, NULL, NULL) == 1);
        CHECK(secp256k1_memcmp_var(out, out_base, 32) == 0);

        CHECK(secp256k1_ec_pubkey_create(CTX, &point, s_inv) == 1);
        CHECK(secp256k1_ecdh(CTX, out_inv, &point, s, NULL, NULL) == 1);
        CHECK(secp256k1_memcmp_var(out_inv, out_base, 32) == 0);
    }
}